

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O3

bool glcts::PipelineStatisticsQueryTestFunctional2::executeClearTexSubImageTest(void *pThis)

{
  code *pcVar1;
  bool bVar2;
  ContextType ctxType;
  deUint32 err;
  long lVar3;
  uchar test_value;
  
  lVar3 = (**(code **)(**(long **)(*(long *)((long)pThis + 0x70) + 8) + 0x18))();
  ctxType.super_ApiType.m_bits =
       (ApiType)(**(code **)(**(long **)(*(long *)((long)pThis + 0x70) + 8) + 0x10))();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x144);
  pcVar1 = *(code **)(lVar3 + 0x218);
  if (pcVar1 != (code *)0x0 || bVar2) {
    test_value = 0xff;
    (*pcVar1)(*(undefined4 *)((long)pThis + 0xdc),0,0,0,0,*(uint *)((long)pThis + 0xe8) >> 1,
              *(uint *)((long)pThis + 0xe4) >> 1,1,0x1903,0x1401,&test_value);
    err = (**(code **)(lVar3 + 0x800))();
    glu::checkError(err,"glClearTexSubImage() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                    ,0xab0);
  }
  return pcVar1 != (code *)0x0 || bVar2;
}

Assistant:

bool PipelineStatisticsQueryTestFunctional2::executeClearTexSubImageTest(void* pThis)
{
	PipelineStatisticsQueryTestFunctional2* data_ptr = (PipelineStatisticsQueryTestFunctional2*)pThis;
	const glw::Functions&					gl		 = data_ptr->m_context.getRenderContext().getFunctions();
	bool									result   = true;

	if (!glu::contextSupports(data_ptr->m_context.getRenderContext().getType(), glu::ApiType::core(4, 4)) &&
		gl.clearTexSubImage == NULL)
	{
		/* API is unavailable */
		return false;
	}

	/* Execute the API call */
	const unsigned char test_value = 0xFF;

	gl.clearTexSubImage(data_ptr->m_to_draw_fbo_id, 0,							/* level */
						0,														/* xoffset */
						0,														/* yoffset */
						0,														/* zoffset */
						data_ptr->m_to_width / 2, data_ptr->m_to_height / 2, 1, /* depth */
						GL_RED, GL_UNSIGNED_BYTE, &test_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearTexSubImage() call failed.");

	/* All done */
	return result;
}